

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_cmd_ln.c
# Opt level: O3

int parse_cmd_ln(int argc,char **argv)

{
  cmd_ln_t *pcVar1;
  long lVar2;
  long lVar3;
  char examplestr [350];
  char helpstr [405];
  undefined1 auStack_318 [352];
  undefined1 local_1b8 [416];
  
  memcpy(local_1b8,
         "Description: \nCopy parameters such as means and variances from one model to another model.  \nYou need to specify a \"copy operation file\" which each operation looks like \nthis \ndest_idx1 src_idx1 \ndest_idx2 src_idx2 \ndest_idx3 src_idx3 \n.\n.\n.\nFor example, the first line will instruct cp_param copy src model index 1 to \ndestionation model index 1. \nThis tool is still under heavy development at 20040807 "
         ,0x195);
  memcpy(auStack_318,
         "Example: \nThis example copy mean from a single file from the source file to 5 mean vector in  \nth destination file. \nFirst you need to prepare a file like this \n0 0 \n1 0 \n2 0 \n3 0 \n4 0 \n\nLets call it cp_op \ncp_parm -cpopsfn  cp_op \n        -igaufn   globalmean \n        -ncbout   5 \n        -ogaufn   out.means \n        -feat    [Your feature type] "
         ,0x15e);
  cmd_ln_parse(parse_cmd_ln::defn,argc,argv,1);
  pcVar1 = cmd_ln_get();
  lVar2 = cmd_ln_int_r(pcVar1,"-help");
  pcVar1 = cmd_ln_get();
  lVar3 = cmd_ln_int_r(pcVar1,"-example");
  if ((int)lVar2 != 0) {
    printf("%s\n\n",local_1b8);
  }
  if ((int)lVar3 != 0) {
    printf("%s\n\n",auStack_318);
  }
  if ((int)lVar3 == 0 && (int)lVar2 == 0) {
    return 0;
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/cp_parm/parse_cmd_ln.c"
          ,0x4c,"User asked for help or example.\n");
  exit(0);
}

Assistant:

int
parse_cmd_ln(int argc, char *argv[])
{
  uint32      isHelp;
  uint32      isExample;

#include "cmd_ln_defn.h"

    cmd_ln_parse(defn, argc, argv, 1);

    isHelp    = cmd_ln_int32("-help");
    isExample    = cmd_ln_int32("-example");

    if(isHelp){
      printf("%s\n\n",helpstr);
    }

    if(isExample){
      printf("%s\n\n",examplestr);
    }

    if(isHelp || isExample){
      E_INFO("User asked for help or example.\n");
      exit(0);
    }


    return 0;
}